

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::DenseVector::_internal_add_values(DenseVector *this,double value)

{
  double local_18;
  double value_local;
  DenseVector *this_local;
  
  local_18 = value;
  value_local = (double)this;
  google::protobuf::RepeatedField<double>::Add(&this->values_,&local_18);
  return;
}

Assistant:

inline void DenseVector::_internal_add_values(double value) {
  values_.Add(value);
}